

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_attribute<char> * __thiscall
rapidxml::xml_attribute<char>::next_attribute
          (xml_attribute<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  char *p1;
  size_t size1;
  xml_attribute<char> *local_50;
  xml_attribute<char> *local_38;
  xml_attribute<char> *attribute;
  size_t sStack_28;
  bool case_sensitive_local;
  size_t name_size_local;
  char *name_local;
  xml_attribute<char> *this_local;
  
  if (name == (char *)0x0) {
    if ((this->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
      local_50 = (xml_attribute<char> *)0x0;
    }
    else {
      local_50 = this->m_next_attribute;
    }
    this_local = local_50;
  }
  else {
    sStack_28 = name_size;
    if (name_size == 0) {
      sStack_28 = internal::measure<char>(name);
    }
    for (local_38 = this->m_next_attribute; local_38 != (xml_attribute<char> *)0x0;
        local_38 = local_38->m_next_attribute) {
      p1 = xml_base<char>::name(&local_38->super_xml_base<char>);
      size1 = xml_base<char>::name_size(&local_38->super_xml_base<char>);
      bVar1 = internal::compare<char>(p1,size1,name,sStack_28,case_sensitive);
      if (bVar1) {
        return local_38;
      }
    }
    this_local = (xml_attribute<char> *)0x0;
  }
  return this_local;
}

Assistant:

xml_attribute<Ch> *next_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_next_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return this->m_parent ? m_next_attribute : 0;
        }